

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O3

completion * __thiscall
mjs::interpreter::impl::eval(completion *__return_storage_ptr__,impl *this,statement *s)

{
  uint32_t uVar1;
  gc_heap *this_00;
  int iVar2;
  void *pvVar3;
  completion local_70;
  
  if (this->gc_cooldown_ == 0) {
    this_00 = this->heap_;
    uVar1 = (this_00->alloc_context_).start_;
    if ((int)(((ulong)((this_00->alloc_context_).next_free_ - uVar1) * 100) /
             (ulong)((this_00->alloc_context_).capacity_ - uVar1)) < 0x5b) goto LAB_001292d7;
    gc_heap::garbage_collect(this_00);
    iVar2 = 1000;
  }
  else {
    iVar2 = this->gc_cooldown_ + -1;
  }
  this->gc_cooldown_ = iVar2;
LAB_001292d7:
  completion::completion(__return_storage_ptr__,(value *)&value::undefined,normal);
  (this->current_extend_).file.super___shared_ptr<mjs::source_file,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (s->super_syntax_node).extend_.file.
           super___shared_ptr<mjs::source_file,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->current_extend_).file.
              super___shared_ptr<mjs::source_file,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             &(s->super_syntax_node).extend_.file.
              super___shared_ptr<mjs::source_file,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  uVar1 = (s->super_syntax_node).extend_.end;
  (this->current_extend_).start = (s->super_syntax_node).extend_.start;
  (this->current_extend_).end = uVar1;
  pvVar3 = gc_heap_ptr_untyped::get(&(this->global_).super_gc_heap_ptr_untyped);
  if (*(int *)((long)pvVar3 + 0x20) < 1) {
    accept<mjs::interpreter::impl>(&local_70,s,this);
    __return_storage_ptr__->type = local_70.type;
    value::operator=(&__return_storage_ptr__->result,&local_70.result);
    (__return_storage_ptr__->target)._M_len = local_70.target._M_len;
    (__return_storage_ptr__->target)._M_str = local_70.target._M_str;
    value::destroy(&local_70.result);
  }
  else {
    accept<mjs::interpreter::impl>(&local_70,s,this);
    __return_storage_ptr__->type = local_70.type;
    value::operator=(&__return_storage_ptr__->result,&local_70.result);
    (__return_storage_ptr__->target)._M_len = local_70.target._M_len;
    (__return_storage_ptr__->target)._M_str = local_70.target._M_str;
    value::destroy(&local_70.result);
  }
  if ((this->on_statement_executed_).super__Function_base._M_manager != (_Manager_type)0x0) {
    (*(this->on_statement_executed_)._M_invoker)
              ((_Any_data *)&this->on_statement_executed_,s,__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

completion eval(const statement& s) {
        if (!gc_cooldown_) {
            if (heap_.use_percentage() > 90) {
                heap_.garbage_collect();
                gc_cooldown_ = 1000; // Arbitrary, but avoid collecting all the time when close to full
            }
        } else {
            --gc_cooldown_;
        }

        completion res{};

        current_extend(s.extend());

        if (global_->language_version() >= version::es3) {
            try {
                res = accept(s, *this);
            } catch (const native_error_exception& e) {
                res = completion{value{e.make_error_object(global_)}, completion_type::throw_};
            }
        } else {
            res = accept(s, *this);
        }
        if (on_statement_executed_) {
            on_statement_executed_(s, res);
        }
        return res;
    }